

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::Matchers::Impl::MatcherUntypedBase::~MatcherUntypedBase(MatcherUntypedBase *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_MatcherUntypedBase = (_func_int **)&PTR__MatcherUntypedBase_001c9030;
  pcVar1 = (this->m_cachedToString)._M_dataplus._M_p;
  paVar2 = &(this->m_cachedToString).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

MatcherUntypedBase::~MatcherUntypedBase() = default;